

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

Parser * __thiscall cli::Parser::stringify<unsigned_long>(Parser *this,unsigned_long *value)

{
  unsigned_long *value_local;
  
  std::__cxx11::to_string((__cxx11 *)this,*value);
  return this;
}

Assistant:

static std::string stringify(const T& value) {
			return std::to_string(value);
		}